

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O3

int av1_quantize_fp_no_qmatrix
              (int16_t *quant_ptr,int16_t *dequant_ptr,int16_t *round_ptr,int log_scale,
              int16_t *scan,int coeff_count,tran_low_t *coeff_ptr,tran_low_t *qcoeff_ptr,
              tran_low_t *dqcoeff_ptr)

{
  size_t __n;
  short sVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  int local_54;
  int local_50 [2];
  short *local_48;
  long local_40;
  int16_t *local_38;
  
  local_40 = (long)coeff_count;
  __n = local_40 * 4;
  local_54 = 0;
  local_48 = round_ptr;
  local_38 = quant_ptr;
  memset(qcoeff_ptr,0,__n);
  memset(dqcoeff_ptr,0,__n);
  bVar4 = (byte)log_scale;
  iVar3 = (1 << (bVar4 & 0x1f)) >> 1;
  local_50[0] = *local_48 + iVar3 >> (bVar4 & 0x1f);
  local_50[1] = local_48[1] + iVar3 >> (bVar4 & 0x1f);
  if (0 < (int)local_40) {
    local_54 = 0;
    uVar6 = 0;
    do {
      lVar7 = (long)scan[uVar6];
      bVar10 = lVar7 != 0;
      iVar3 = coeff_ptr[lVar7];
      iVar2 = -iVar3;
      if (0 < iVar3) {
        iVar2 = iVar3;
      }
      sVar1 = dequant_ptr[bVar10];
      if ((long)sVar1 <= (long)iVar2 << (bVar4 + 1 & 0x3f)) {
        lVar5 = (long)local_50[bVar10] + (long)iVar2;
        if (0x7ffe < lVar5) {
          lVar5 = 0x7fff;
        }
        if (lVar5 < -0x7fff) {
          lVar5 = -0x8000;
        }
        lVar5 = local_38[bVar10] * lVar5 >> (0x10 - bVar4 & 0x3f);
        if (lVar5 != 0) {
          uVar8 = iVar3 >> 0x1f;
          uVar9 = (uint)lVar5;
          qcoeff_ptr[lVar7] = (uVar8 ^ uVar9) - uVar8;
          dqcoeff_ptr[lVar7] = ((int)((int)sVar1 * uVar9) >> (bVar4 & 0x1f) ^ uVar8) - uVar8;
          local_54 = (int)uVar6 + 1;
        }
      }
      uVar8 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar8;
    } while ((int)uVar8 < coeff_count);
  }
  return local_54;
}

Assistant:

int av1_quantize_fp_no_qmatrix(const int16_t quant_ptr[2],
                               const int16_t dequant_ptr[2],
                               const int16_t round_ptr[2], int log_scale,
                               const int16_t *scan, int coeff_count,
                               const tran_low_t *coeff_ptr,
                               tran_low_t *qcoeff_ptr,
                               tran_low_t *dqcoeff_ptr) {
  memset(qcoeff_ptr, 0, coeff_count * sizeof(*qcoeff_ptr));
  memset(dqcoeff_ptr, 0, coeff_count * sizeof(*dqcoeff_ptr));
  const int rounding[2] = { ROUND_POWER_OF_TWO(round_ptr[0], log_scale),
                            ROUND_POWER_OF_TWO(round_ptr[1], log_scale) };
  int eob = 0;
  for (int i = 0; i < coeff_count; i++) {
    const int rc = scan[i];
    const int32_t thresh = (int32_t)(dequant_ptr[rc != 0]);
    const int coeff = coeff_ptr[rc];
    const int coeff_sign = AOMSIGN(coeff);
    int64_t abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
    int tmp32 = 0;
    if ((abs_coeff << (1 + log_scale)) >= thresh) {
      abs_coeff = clamp64(abs_coeff + rounding[rc != 0], INT16_MIN, INT16_MAX);
      tmp32 = (int)((abs_coeff * quant_ptr[rc != 0]) >> (16 - log_scale));
      if (tmp32) {
        qcoeff_ptr[rc] = (tmp32 ^ coeff_sign) - coeff_sign;
        const tran_low_t abs_dqcoeff =
            (tmp32 * dequant_ptr[rc != 0]) >> log_scale;
        dqcoeff_ptr[rc] = (abs_dqcoeff ^ coeff_sign) - coeff_sign;
      }
    }
    if (tmp32) eob = i + 1;
  }
  return eob;
}